

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

int bitset_container_rank(bitset_container_t *container,uint16_t x)

{
  ulong uVar1;
  undefined6 in_register_00000032;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = CONCAT62(in_register_00000032,x) & 0xffffffff;
  if ((ushort)uVar4 < 0x40) {
    uVar3 = 0;
    iVar2 = 0;
  }
  else {
    uVar3 = CONCAT62(in_register_00000032,x) >> 6 & 0x3ffffff;
    uVar1 = 0;
    iVar2 = 0;
    do {
      uVar5 = container->words[uVar1] - (container->words[uVar1] >> 1 & 0x5555555555555555);
      uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
      iVar2 = iVar2 + (uint)(byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                  0x38);
      uVar1 = uVar1 + 1;
    } while (uVar3 != uVar1);
  }
  uVar4 = (2L << ((byte)uVar4 & 0x3f)) - 1U & container->words[uVar3];
  uVar4 = uVar4 - (uVar4 >> 1 & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  return (uint)(byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
         iVar2;
}

Assistant:

int bitset_container_rank(const bitset_container_t *container, uint16_t x) {
  // credit: aqrit
  int sum = 0;
  int i = 0;
  for (int end = x / 64; i < end; i++){
    sum += roaring_hamming(container->words[i]);
  }
  uint64_t lastword = container->words[i];
  uint64_t lastpos = UINT64_C(1) << (x % 64);
  uint64_t mask = lastpos + lastpos - 1; // smear right
  sum += roaring_hamming(lastword & mask);
  return sum;
}